

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

_Bool xm_is_channel_active(xm_context_t *ctx,uint16_t chn)

{
  xm_channel_context_t *pxVar1;
  bool bVar2;
  undefined2 in_register_00000032;
  
  if ((CONCAT22(in_register_00000032,chn) == 0) || ((ctx->module).num_channels < chn)) {
    xm_is_channel_active_cold_1();
  }
  pxVar1 = ctx->channels;
  if ((pxVar1[(ulong)chn - 1].instrument == (xm_instrument_t *)0x0) ||
     (pxVar1[(ulong)chn - 1].sample == (xm_sample_t *)0x0)) {
    bVar2 = false;
  }
  else {
    bVar2 = 0.0 <= pxVar1[(ulong)chn - 1].sample_position;
  }
  return bVar2;
}

Assistant:

bool xm_is_channel_active(xm_context_t* ctx, uint16_t chn) {
	CHECK_CHANNEL(ctx, chn);
	xm_channel_context_t* ch = ctx->channels + (chn - 1);
	return ch->instrument != NULL && ch->sample != NULL && ch->sample_position >= 0;
}